

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O3

ColorFilterNode * rengine::ColorFilterNode::create(void)

{
  undefined1 *puVar1;
  ColorFilterNode *pCVar2;
  
  if (__allocation_pool_rengine_ColorFilterNode.m_nextFree <
      __allocation_pool_rengine_ColorFilterNode.m_poolSize) {
    pCVar2 = AllocationPool<rengine::ColorFilterNode>::allocate
                       (&__allocation_pool_rengine_ColorFilterNode);
    puVar1 = &(pCVar2->super_Node).field_0x31;
    *puVar1 = *puVar1 | 2;
  }
  else {
    pCVar2 = (ColorFilterNode *)operator_new(0x78);
    (pCVar2->super_Node).super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    (pCVar2->super_Node).m_parent = (Node *)0x0;
    (pCVar2->super_Node).m_child = (Node *)0x0;
    (pCVar2->super_Node).m_next = (Node *)0x0;
    (pCVar2->super_Node).m_prev = (Node *)0x0;
    *(undefined4 *)&(pCVar2->super_Node).field_0x30 = 3;
    (pCVar2->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)&PTR__Node_00115c10
    ;
    *(undefined8 *)&(pCVar2->super_Node).field_0x34 = 0x3f800000;
    *(undefined8 *)&pCVar2->field_0x3c = 0;
    *(undefined8 *)&pCVar2->field_0x44 = 0x3f80000000000000;
    *(undefined8 *)&pCVar2->field_0x4c = 0;
    *(undefined8 *)&pCVar2->field_0x54 = 0;
    *(undefined8 *)&pCVar2->field_0x5c = 0x3f800000;
    *(undefined8 *)&pCVar2->field_0x64 = 0;
    *(undefined8 *)&pCVar2->field_0x6c = 0x3f80000000000000;
    *(undefined4 *)&pCVar2->field_0x74 = 0;
  }
  return pCVar2;
}

Assistant:

ColorFilterNode *create(mat4 matrix) {
        auto node = create();
        node->setColorMatrix(matrix);
        return node;
    }